

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_function_binary.h
# Opt level: O0

vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
* __thiscall
lf::mesh::utils::
MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/ipdg_stokes/examples/manufactured_solution/manufactured_solution.cc:188:9)>_>
::operator()(vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
             *__return_storage_ptr__,
            MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
            *this,Entity *e,MatrixXd *local)

{
  vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_58;
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_40;
  MatrixXd *local_28;
  MatrixXd *local_local;
  Entity *e_local;
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
  *this_local;
  
  local_28 = local;
  local_local = (MatrixXd *)e;
  e_local = (Entity *)this;
  this_local = (MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
                *)__return_storage_ptr__;
  projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>::operator()
            (&local_40,&this->a_,e,local);
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/ipdg_stokes/examples/manufactured_solution/manufactured_solution.cc:188:9)>
  ::operator()(&local_58,&this->b_,(Entity *)local_local,local_28);
  internal::OperatorSubtraction::operator()
            (__return_storage_ptr__,(OperatorSubtraction *)this,&local_40,&local_58,0);
  std::
  vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  ::~vector(&local_58);
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::~vector(&local_40);
  return __return_storage_ptr__;
}

Assistant:

auto operator()(const lf::mesh::Entity& e,
                  const Eigen::MatrixXd& local) const {
    return op_(a_(e, local), b_(e, local), 0);
  }